

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall
deci::ast_binary_t::ast_binary_t(ast_binary_t *this,string *identifier,ast_item_t *a,ast_item_t *b)

{
  ast_item_t *b_local;
  ast_item_t *a_local;
  string *identifier_local;
  ast_binary_t *this_local;
  
  ast_item_t::ast_item_t(&this->super_ast_item_t);
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0013a4b8;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->a = a;
  this->b = b;
  return;
}

Assistant:

ast_binary_t::ast_binary_t(const std::string& identifier, ast_item_t* a, ast_item_t* b)
    :identifier(identifier),a(a),b(b) {
      ;
  }